

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein.cpp
# Opt level: O3

void duckdb::LevenshteinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  long *plVar4;
  data_ptr_t pdVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  anon_class_8_1_6971b95b aVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  ValidityMask *pVVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  reference vector;
  reference vector_00;
  long lVar15;
  idx_t iVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  long lVar19;
  idx_t iVar20;
  ulong uVar21;
  ulong uVar22;
  data_ptr_t pdVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  idx_t iVar26;
  ulong uVar27;
  undefined8 in_R8;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  data_ptr_t pdVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  Vector *pVVar32;
  idx_t local_110;
  data_ptr_t local_108;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (long *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      left.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
      left.value._0_8_ = *(undefined8 *)(vector->data + 8);
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = *(undefined8 *)(vector_00->data + 8);
      lVar15 = BinaryLambdaWrapper::
               Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                         (*(Vector **)vector->data,left,right,in_R9,in_stack_fffffffffffffee8);
      *plVar4 = lVar15;
      return;
    }
  }
  else {
    local_110 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar5 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_108 = vector->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        pVVar32 = result;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar28 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_110 == 0) {
            return;
          }
          uVar6 = *(undefined8 *)pdVar5;
          uVar7 = *(undefined8 *)(pdVar5 + 8);
          local_108 = local_108 + 8;
          iVar26 = 0;
          do {
            left_05.value.pointer.ptr = (char *)uVar6;
            left_05.value._0_8_ = *(undefined8 *)local_108;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = uVar7;
            lVar15 = BinaryLambdaWrapper::
                     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               (*(Vector **)(local_108 + -8),left_05,right_05,in_R9,(idx_t)pVVar32);
            *(long *)(pdVar28 + iVar26 * 8) = lVar15;
            iVar26 = iVar26 + 1;
            local_108 = local_108 + 0x10;
          } while (local_110 != iVar26);
          return;
        }
        if (local_110 + 0x3f < 0x40) {
          return;
        }
        uVar22 = 0;
        uVar30 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar21 = uVar30 + 0x40;
            if (local_110 <= uVar30 + 0x40) {
              uVar21 = local_110;
            }
LAB_0102c590:
            uVar27 = uVar30;
            if (uVar30 < uVar21) {
              uVar6 = *(undefined8 *)pdVar5;
              uVar7 = *(undefined8 *)(pdVar5 + 8);
              pdVar23 = local_108 + uVar30 * 0x10 + 8;
              do {
                left_00.value.pointer.ptr = (char *)uVar6;
                left_00.value._0_8_ = *(undefined8 *)pdVar23;
                right_00.value.pointer.ptr = (char *)in_R8;
                right_00.value._0_8_ = uVar7;
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(pdVar23 + -8),left_00,right_00,in_R9,(idx_t)pVVar32
                                   );
                *(long *)(pdVar28 + uVar30 * 8) = lVar15;
                uVar30 = uVar30 + 1;
                pdVar23 = pdVar23 + 0x10;
                uVar27 = uVar21;
                result = pVVar32;
              } while (uVar21 != uVar30);
            }
          }
          else {
            uVar31 = puVar3[uVar22];
            uVar21 = uVar30 + 0x40;
            if (local_110 <= uVar30 + 0x40) {
              uVar21 = local_110;
            }
            uVar27 = uVar21;
            result = pVVar32;
            if (uVar31 != 0) {
              if (uVar31 == 0xffffffffffffffff) goto LAB_0102c590;
              uVar27 = uVar30;
              if (uVar30 < uVar21) {
                pdVar23 = local_108 + uVar30 * 0x10 + 8;
                uVar24 = 0;
                do {
                  if ((uVar31 >> (uVar24 & 0x3f) & 1) != 0) {
                    left_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar5;
                    left_01.value._0_8_ = *(undefined8 *)pdVar23;
                    right_01.value.pointer.ptr = (char *)in_R8;
                    right_01.value._0_8_ = *(undefined8 *)(pdVar5 + 8);
                    lVar15 = BinaryLambdaWrapper::
                             Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       (*(Vector **)(pdVar23 + -8),left_01,right_01,in_R9,
                                        (idx_t)pVVar32);
                    *(long *)(pdVar28 + uVar24 * 8 + uVar30 * 8) = lVar15;
                  }
                  uVar24 = uVar24 + 1;
                  pdVar23 = pdVar23 + 0x10;
                  uVar27 = uVar21;
                  result = pVVar32;
                } while (uVar21 - uVar30 != uVar24);
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar30 = uVar27;
          if (uVar22 == local_110 + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar5 = vector->data;
          pdVar28 = vector_00->data;
          pVVar32 = result;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar23 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,local_110);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_110 != 0) {
              lVar15 = 0;
              do {
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(pdVar28 + lVar15 * 2);
                left_10.value._0_8_ = *(undefined8 *)(pdVar5 + lVar15 * 2 + 8);
                right_10.value.pointer.ptr = (char *)in_R8;
                right_10.value._0_8_ = *(undefined8 *)(pdVar28 + lVar15 * 2 + 8);
                lVar19 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(pdVar5 + lVar15 * 2),left_10,right_10,in_R9,
                                    (idx_t)pVVar32);
                *(long *)(pdVar23 + lVar15) = lVar19;
                lVar15 = lVar15 + 8;
                local_110 = local_110 - 1;
              } while (local_110 != 0);
            }
          }
          else if (0x3f < local_110 + 0x3f) {
            uVar22 = 0;
            uVar30 = 0;
            do {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar21 = uVar30 + 0x40;
                if (local_110 <= uVar30 + 0x40) {
                  uVar21 = local_110;
                }
LAB_0102ca8d:
                uVar27 = uVar30;
                if (uVar30 < uVar21) {
                  uVar31 = uVar30 << 4 | 8;
                  do {
                    left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar28 + (uVar31 - 8));
                    left_06.value._0_8_ = *(undefined8 *)(pdVar5 + uVar31);
                    right_06.value.pointer.ptr = (char *)in_R8;
                    right_06.value._0_8_ = *(undefined8 *)(pdVar28 + uVar31);
                    lVar15 = BinaryLambdaWrapper::
                             Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       (*(Vector **)(pdVar5 + (uVar31 - 8)),left_06,right_06,in_R9,
                                        uVar22);
                    *(long *)(pdVar23 + uVar30 * 8) = lVar15;
                    uVar30 = uVar30 + 1;
                    uVar31 = uVar31 + 0x10;
                    uVar27 = uVar21;
                  } while (uVar21 != uVar30);
                }
              }
              else {
                uVar31 = puVar3[uVar22];
                uVar21 = uVar30 + 0x40;
                if (local_110 <= uVar30 + 0x40) {
                  uVar21 = local_110;
                }
                uVar27 = uVar21;
                if (uVar31 != 0) {
                  if (uVar31 == 0xffffffffffffffff) goto LAB_0102ca8d;
                  uVar27 = uVar30;
                  if (uVar30 < uVar21) {
                    uVar29 = uVar30 << 4 | 8;
                    uVar24 = 0;
                    do {
                      if ((uVar31 >> (uVar24 & 0x3f) & 1) != 0) {
                        left_07.value.pointer.ptr = (char *)*(undefined8 *)(pdVar28 + (uVar29 - 8));
                        left_07.value._0_8_ = *(undefined8 *)(pdVar5 + uVar29);
                        right_07.value.pointer.ptr = (char *)in_R8;
                        right_07.value._0_8_ = *(undefined8 *)(pdVar28 + uVar29);
                        lVar15 = BinaryLambdaWrapper::
                                 Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                           (*(Vector **)(pdVar5 + (uVar29 - 8)),left_07,right_07,
                                            in_R9,uVar22);
                        *(long *)(pdVar23 + uVar24 * 8 + uVar30 * 8) = lVar15;
                      }
                      uVar24 = uVar24 + 1;
                      uVar29 = uVar29 + 0x10;
                      uVar27 = uVar21;
                    } while (uVar21 - uVar30 != uVar24);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              uVar30 = uVar27;
            } while (uVar22 != local_110 + 0x3f >> 6);
          }
        }
        else {
          pVVar32 = result;
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,local_110,&local_78);
          Vector::ToUnifiedFormat(vector_00,local_110,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar5 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_110 != 0) {
              psVar8 = (local_78.sel)->sel_vector;
              psVar9 = (local_c0.sel)->sel_vector;
              iVar26 = 0;
              do {
                iVar16 = iVar26;
                if (psVar8 != (sel_t *)0x0) {
                  iVar16 = (idx_t)psVar8[iVar26];
                }
                iVar20 = iVar26;
                if (psVar9 != (sel_t *)0x0) {
                  iVar20 = (idx_t)psVar9[iVar26];
                }
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar20 * 0x10);
                left_02.value._0_8_ = *(undefined8 *)(local_78.data + iVar16 * 0x10 + 8);
                right_02.value.pointer.ptr = (char *)in_R8;
                right_02.value._0_8_ = *(undefined8 *)(local_c0.data + iVar20 * 0x10 + 8);
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_78.data + iVar16 * 0x10),left_02,right_02,
                                    in_R9,(idx_t)pVVar32);
                *(long *)(pdVar5 + iVar26 * 8) = lVar15;
                iVar26 = iVar26 + 1;
              } while (local_110 != iVar26);
            }
          }
          else if (local_110 != 0) {
            psVar8 = (local_78.sel)->sel_vector;
            psVar9 = (local_c0.sel)->sel_vector;
            pVVar12 = &pVVar32->validity;
            uVar30 = 0;
            do {
              uVar22 = uVar30;
              if (psVar8 != (sel_t *)0x0) {
                uVar22 = (ulong)psVar8[uVar30];
              }
              uVar21 = uVar30;
              if (psVar9 != (sel_t *)0x0) {
                uVar21 = (ulong)psVar9[uVar30];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar21 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(local_78.data + uVar22 * 0x10 + 8);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_c0.data + uVar21 * 0x10 + 8);
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (*(Vector **)(local_78.data + uVar22 * 0x10),left_08,right_08,
                                    in_R9,(idx_t)pVVar32);
                *(long *)(pdVar5 + uVar30 * 8) = lVar15;
              }
              else {
                _Var18._M_head_impl =
                     (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var18._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var14 = p_Stack_d0;
                  peVar13 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar13;
                  (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var14;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(pVVar12->super_TemplatedValidityMask<unsigned_long>).
                                        validity_data);
                  _Var18._M_head_impl =
                       (pTVar17->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar32->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var18._M_head_impl;
                }
                bVar11 = (byte)uVar30 & 0x3f;
                _Var18._M_head_impl[uVar30 >> 6] =
                     _Var18._M_head_impl[uVar30 >> 6] &
                     (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
              }
              uVar30 = uVar30 + 1;
            } while (local_110 != uVar30);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar5 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar28 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        pVVar32 = result;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar23 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_110 == 0) {
            return;
          }
          aVar10.result = *(Vector **)pdVar5;
          uVar6 = *(undefined8 *)(pdVar5 + 8);
          pdVar28 = pdVar28 + 8;
          iVar26 = 0;
          do {
            left_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar28 + -8);
            left_09.value._0_8_ = uVar6;
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *(undefined8 *)pdVar28;
            lVar15 = BinaryLambdaWrapper::
                     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                               (aVar10,left_09,right_09,in_R9,(idx_t)pVVar32);
            *(long *)(pdVar23 + iVar26 * 8) = lVar15;
            iVar26 = iVar26 + 1;
            pdVar28 = pdVar28 + 0x10;
          } while (local_110 != iVar26);
          return;
        }
        if (local_110 + 0x3f < 0x40) {
          return;
        }
        uVar30 = 0;
        uVar22 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar21 = uVar30 + 0x40;
            if (local_110 <= uVar30 + 0x40) {
              uVar21 = local_110;
            }
LAB_0102c861:
            uVar27 = uVar30;
            if (uVar30 < uVar21) {
              aVar10.result = *(Vector **)pdVar5;
              uVar6 = *(undefined8 *)(pdVar5 + 8);
              pdVar25 = pdVar28 + uVar30 * 0x10 + 8;
              do {
                left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + -8);
                left_03.value._0_8_ = uVar6;
                right_03.value.pointer.ptr = (char *)in_R8;
                right_03.value._0_8_ = *(undefined8 *)pdVar25;
                lVar15 = BinaryLambdaWrapper::
                         Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                   (aVar10,left_03,right_03,in_R9,(idx_t)pVVar32);
                *(long *)(pdVar23 + uVar30 * 8) = lVar15;
                uVar30 = uVar30 + 1;
                pdVar25 = pdVar25 + 0x10;
                uVar27 = uVar21;
                result = pVVar32;
              } while (uVar21 != uVar30);
            }
          }
          else {
            uVar31 = puVar3[uVar22];
            uVar21 = uVar30 + 0x40;
            if (local_110 <= uVar30 + 0x40) {
              uVar21 = local_110;
            }
            uVar27 = uVar21;
            result = pVVar32;
            if (uVar31 != 0) {
              if (uVar31 == 0xffffffffffffffff) goto LAB_0102c861;
              uVar27 = uVar30;
              if (uVar30 < uVar21) {
                pdVar25 = pdVar28 + uVar30 * 0x10 + 8;
                uVar24 = 0;
                do {
                  if ((uVar31 >> (uVar24 & 0x3f) & 1) != 0) {
                    left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + -8);
                    left_04.value._0_8_ = *(undefined8 *)(pdVar5 + 8);
                    right_04.value.pointer.ptr = (char *)in_R8;
                    right_04.value._0_8_ = *(undefined8 *)pdVar25;
                    lVar15 = BinaryLambdaWrapper::
                             Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                       (*(Vector **)pdVar5,left_04,right_04,in_R9,(idx_t)pVVar32);
                    *(long *)(pdVar23 + uVar24 * 8 + uVar30 * 8) = lVar15;
                  }
                  uVar24 = uVar24 + 1;
                  pdVar25 = pdVar25 + 0x10;
                  uVar27 = uVar21;
                  result = pVVar32;
                } while (uVar21 - uVar30 != uVar24);
              }
            }
          }
          uVar30 = uVar27;
          uVar22 = uVar22 + 1;
          if (uVar22 == local_110 + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void LevenshteinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, int64_t>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return LevenshteinScalarFunction(result, str, tgt); });
}